

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collada.cpp
# Opt level: O2

void CS248::Collada::ColladaParser::parse_light(XMLElement *xml,LightInfo *light)

{
  bool bVar1;
  undefined4 uVar2;
  int iVar3;
  XMLElement *pXVar4;
  XMLElement *pXVar5;
  char *pcVar6;
  XMLElement *pXVar7;
  XMLElement *pXVar8;
  XMLElement *this;
  XMLElement *this_00;
  string *this_01;
  double dVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  Spectrum SVar12;
  allocator local_279;
  string color_string;
  string type;
  string local_230;
  string local_210;
  string local_1f0;
  string local_1d0;
  string local_1b0;
  string local_190;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  tinyxml2::XMLElement::Attribute(xml,"id",(char *)0x0);
  std::__cxx11::string::assign((char *)&(light->super_Instance).id);
  tinyxml2::XMLElement::Attribute(xml,"name",(char *)0x0);
  std::__cxx11::string::assign((char *)&(light->super_Instance).name);
  (light->super_Instance).type = LIGHT;
  pXVar4 = get_technique_common(xml);
  pXVar5 = get_technique_cmu462(xml);
  if (pXVar5 != (XMLElement *)0x0) {
    pXVar4 = pXVar5;
  }
  if (pXVar4 == (XMLElement *)0x0) goto LAB_001634ec;
  pXVar4 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,(char *)0x0);
  if (pXVar4 == (XMLElement *)0x0) {
    return;
  }
  pcVar6 = tinyxml2::XMLNode::Value(&pXVar4->super_XMLNode);
  std::__cxx11::string::string((string *)&type,pcVar6,(allocator *)&color_string);
  bVar1 = std::operator==(&type,"ambient");
  if (bVar1) {
    light->light_type = AMBIENT;
    std::__cxx11::string::string((string *)&local_50,"color",(allocator *)&color_string);
    pXVar4 = get_element(pXVar4,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (pXVar4 == (XMLElement *)0x0) goto LAB_001634ec;
    pcVar6 = tinyxml2::XMLElement::GetText(pXVar4);
    std::__cxx11::string::string((string *)&color_string,pcVar6,&local_279);
    std::__cxx11::string::string((string *)&local_70,(string *)&color_string);
    SVar12 = spectrum_from_string(&local_70);
    light->spectrum = SVar12;
    this_01 = &local_70;
  }
  else {
    bVar1 = std::operator==(&type,"directional");
    if (bVar1) {
      light->light_type = DIRECTIONAL;
      std::__cxx11::string::string((string *)&local_90,"color",(allocator *)&color_string);
      pXVar4 = get_element(pXVar4,&local_90);
      std::__cxx11::string::~string((string *)&local_90);
      if (pXVar4 == (XMLElement *)0x0) goto LAB_001634ec;
      pcVar6 = tinyxml2::XMLElement::GetText(pXVar4);
      std::__cxx11::string::string((string *)&color_string,pcVar6,&local_279);
      std::__cxx11::string::string((string *)&local_b0,(string *)&color_string);
      SVar12 = spectrum_from_string(&local_b0);
      light->spectrum = SVar12;
      this_01 = &local_b0;
    }
    else {
      bVar1 = std::operator==(&type,"area");
      if (!bVar1) {
        bVar1 = std::operator==(&type,"point");
        if (bVar1) {
          light->light_type = POINT;
          std::__cxx11::string::string((string *)&local_110,"color",(allocator *)&color_string);
          pXVar5 = get_element(pXVar4,&local_110);
          std::__cxx11::string::~string((string *)&local_110);
          std::__cxx11::string::string
                    ((string *)&local_130,"constant_attenuation",(allocator *)&color_string);
          pXVar7 = get_element(pXVar4,&local_130);
          std::__cxx11::string::~string((string *)&local_130);
          std::__cxx11::string::string
                    ((string *)&local_150,"linear_attenuation",(allocator *)&color_string);
          pXVar8 = get_element(pXVar4,&local_150);
          std::__cxx11::string::~string((string *)&local_150);
          std::__cxx11::string::string
                    ((string *)&local_170,"quadratic_attenuation",(allocator *)&color_string);
          pXVar4 = get_element(pXVar4,&local_170);
          uVar2 = std::__cxx11::string::~string((string *)&local_170);
          auVar10._0_4_ = -(uint)((int)((ulong)pXVar5 >> 0x20) == 0 && (int)pXVar5 == 0);
          auVar10._4_4_ = -(uint)((int)pXVar7 == 0 && (int)((ulong)pXVar7 >> 0x20) == 0);
          auVar10._8_4_ = -(uint)((int)((ulong)pXVar8 >> 0x20) == 0 && (int)pXVar8 == 0);
          auVar10._12_4_ = -(uint)((int)pXVar4 == 0 && (int)((ulong)pXVar4 >> 0x20) == 0);
          iVar3 = movmskps(uVar2,auVar10);
          if (iVar3 != 0) goto LAB_001634ec;
          pcVar6 = tinyxml2::XMLElement::GetText(pXVar5);
          std::__cxx11::string::string((string *)&color_string,pcVar6,&local_279);
          std::__cxx11::string::string((string *)&local_190,(string *)&color_string);
          SVar12 = spectrum_from_string(&local_190);
          light->spectrum = SVar12;
          std::__cxx11::string::~string((string *)&local_190);
          pcVar6 = tinyxml2::XMLElement::GetText(pXVar7);
          dVar9 = atof(pcVar6);
          light->constant_att = (float)dVar9;
          pcVar6 = tinyxml2::XMLElement::GetText(pXVar8);
          dVar9 = atof(pcVar6);
          light->constant_att = (float)dVar9;
          pcVar6 = tinyxml2::XMLElement::GetText(pXVar4);
        }
        else {
          bVar1 = std::operator==(&type,"spot");
          if (!bVar1) {
LAB_001634ec:
            exit(1);
          }
          light->light_type = SPOT;
          std::__cxx11::string::string((string *)&local_1b0,"color",(allocator *)&color_string);
          pXVar5 = get_element(pXVar4,&local_1b0);
          std::__cxx11::string::~string((string *)&local_1b0);
          pXVar7 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"falloff_angle");
          pXVar8 = tinyxml2::XMLNode::FirstChildElement(&pXVar4->super_XMLNode,"falloff_exponent");
          std::__cxx11::string::string
                    ((string *)&local_1d0,"constant_attenuation",(allocator *)&color_string);
          this = get_element(pXVar4,&local_1d0);
          std::__cxx11::string::~string((string *)&local_1d0);
          std::__cxx11::string::string
                    ((string *)&local_1f0,"linear_attenuation",(allocator *)&color_string);
          this_00 = get_element(pXVar4,&local_1f0);
          std::__cxx11::string::~string((string *)&local_1f0);
          std::__cxx11::string::string
                    ((string *)&local_210,"quadratic_attenuation",(allocator *)&color_string);
          pXVar4 = get_element(pXVar4,&local_210);
          uVar2 = std::__cxx11::string::~string((string *)&local_210);
          auVar11._0_4_ = -(uint)((int)((ulong)pXVar5 >> 0x20) == 0 && (int)pXVar5 == 0);
          auVar11._4_4_ = -(uint)((int)pXVar7 == 0 && (int)((ulong)pXVar7 >> 0x20) == 0);
          auVar11._8_4_ = -(uint)((int)((ulong)pXVar8 >> 0x20) == 0 && (int)pXVar8 == 0);
          auVar11._12_4_ = -(uint)((int)this == 0 && (int)((ulong)this >> 0x20) == 0);
          iVar3 = movmskps(uVar2,auVar11);
          if (((iVar3 != 0) || (this_00 == (XMLElement *)0x0)) || (pXVar4 == (XMLElement *)0x0))
          goto LAB_001634ec;
          pcVar6 = tinyxml2::XMLElement::GetText(pXVar5);
          std::__cxx11::string::string((string *)&color_string,pcVar6,&local_279);
          std::__cxx11::string::string((string *)&local_230,(string *)&color_string);
          SVar12 = spectrum_from_string(&local_230);
          light->spectrum = SVar12;
          std::__cxx11::string::~string((string *)&local_230);
          pcVar6 = tinyxml2::XMLElement::GetText(pXVar7);
          dVar9 = atof(pcVar6);
          light->constant_att = (float)dVar9;
          pcVar6 = tinyxml2::XMLElement::GetText(pXVar8);
          dVar9 = atof(pcVar6);
          light->constant_att = (float)dVar9;
          pcVar6 = tinyxml2::XMLElement::GetText(this);
          dVar9 = atof(pcVar6);
          light->constant_att = (float)dVar9;
          pcVar6 = tinyxml2::XMLElement::GetText(this_00);
          dVar9 = atof(pcVar6);
          light->constant_att = (float)dVar9;
          pcVar6 = tinyxml2::XMLElement::GetText(pXVar4);
        }
        dVar9 = atof(pcVar6);
        light->constant_att = (float)dVar9;
        goto LAB_0016309d;
      }
      light->light_type = AREA;
      std::__cxx11::string::string((string *)&local_d0,"color",(allocator *)&color_string);
      pXVar4 = get_element(pXVar4,&local_d0);
      std::__cxx11::string::~string((string *)&local_d0);
      if (pXVar4 == (XMLElement *)0x0) goto LAB_001634ec;
      pcVar6 = tinyxml2::XMLElement::GetText(pXVar4);
      std::__cxx11::string::string((string *)&color_string,pcVar6,&local_279);
      std::__cxx11::string::string((string *)&local_f0,(string *)&color_string);
      SVar12 = spectrum_from_string(&local_f0);
      light->spectrum = SVar12;
      this_01 = &local_f0;
    }
  }
  std::__cxx11::string::~string((string *)this_01);
LAB_0016309d:
  std::__cxx11::string::~string((string *)&color_string);
  std::__cxx11::string::~string((string *)&type);
  return;
}

Assistant:

void ColladaParser::parse_light(XMLElement* xml, LightInfo& light) {
  // name & id
  light.id = xml->Attribute("id");
  light.name = xml->Attribute("name");
  light.type = Instance::LIGHT;

  XMLElement* technique = NULL;
  XMLElement* technique_common = get_technique_common(xml);
  XMLElement* technique_cmu462 = get_technique_cmu462(xml);

  technique = technique_cmu462 ? technique_cmu462 : technique_common;
  if (!technique) {
    stat("Error: No supported profile defined in light: " << light.id);
    exit(EXIT_FAILURE);
  }

  // light parameters
  XMLElement* e_light = technique->FirstChildElement();
  if (e_light) {
    // type
    string type = e_light->Name();

    // type-specific parameters
    if (type == "ambient") {
      light.light_type = LightType::AMBIENT;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string(color_string);
      } else {
        stat("Error: No color definition in ambient light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "directional") {
      light.light_type = LightType::DIRECTIONAL;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string(color_string);
      } else {
        stat("Error: No color definition in directional light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "area") {
      light.light_type = LightType::AREA;
      XMLElement* e_color = get_element(e_light, "color");
      if (e_color) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string(color_string);
      } else {
        stat("Error: No color definition in area light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "point") {
      light.light_type = LightType::POINT;
      XMLElement* e_color = get_element(e_light, "color");
      XMLElement* e_constant_att = get_element(e_light, "constant_attenuation");
      XMLElement* e_linear_att = get_element(e_light, "linear_attenuation");
      XMLElement* e_quadratic_att =
          get_element(e_light, "quadratic_attenuation");
      if (e_color && e_constant_att && e_linear_att && e_quadratic_att) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string(color_string);
        light.constant_att = atof(e_constant_att->GetText());
        light.constant_att = atof(e_linear_att->GetText());
        light.constant_att = atof(e_quadratic_att->GetText());
      } else {
        stat("Error: incomplete definition of point light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else if (type == "spot") {
      light.light_type = LightType::SPOT;
      XMLElement* e_color = get_element(e_light, "color");
      XMLElement* e_falloff_deg = e_light->FirstChildElement("falloff_angle");
      XMLElement* e_falloff_exp =
          e_light->FirstChildElement("falloff_exponent");
      XMLElement* e_constant_att = get_element(e_light, "constant_attenuation");
      XMLElement* e_linear_att = get_element(e_light, "linear_attenuation");
      XMLElement* e_quadratic_att =
          get_element(e_light, "quadratic_attenuation");
      if (e_color && e_falloff_deg && e_falloff_exp && e_constant_att &&
          e_linear_att && e_quadratic_att) {
        string color_string = e_color->GetText();
        light.spectrum = spectrum_from_string(color_string);
        light.constant_att = atof(e_falloff_deg->GetText());
        light.constant_att = atof(e_falloff_exp->GetText());
        light.constant_att = atof(e_constant_att->GetText());
        light.constant_att = atof(e_linear_att->GetText());
        light.constant_att = atof(e_quadratic_att->GetText());
      } else {
        stat("Error: incomplete definition of spot light: " << light.id);
        exit(EXIT_FAILURE);
      }
    } else {
      stat("Error: Light type " << type << " in light: " << light.id
                                << "is not supported");
      exit(EXIT_FAILURE);
    }
  }

  // print summary
  stat("  |- " << light);
}